

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ExecutorTests.cpp
# Opt level: O2

void testExpression(string *expr,double value)

{
  pointer *__ptr;
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *this;
  char *pcVar1;
  _Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  local_458;
  AssertionResult gtest_ar_1;
  AssertHelper local_440;
  undefined1 local_438 [8];
  NumberValueAnalyser analyser;
  Parser parser;
  Executor executor;
  stringstream stream;
  
  std::__cxx11::stringstream::stringstream((stringstream *)&stream,(string *)expr,_S_out|_S_in);
  Parser::Parser(&parser,(istream *)&stream);
  Parser::parseLogicalExpression((Parser *)local_438);
  Executor::Executor(&executor);
  (**(code **)(*(long *)local_438 + 0x10))(local_438,&executor);
  gtest_ar_1.success_ = false;
  gtest_ar_1._1_3_ = 0;
  testing::internal::CmpHelperEQ<TypeName,TypeName>
            ((internal *)&analyser,"val->getType()","TypeName::F32",
             (TypeName *)
             ((long)executor.value_._M_t.super___uniq_ptr_impl<Value,_std::default_delete<Value>_>.
                    _M_t.super__Tuple_impl<0UL,_Value_*,_std::default_delete<Value>_>.
                    super__Head_base<0UL,_Value_*,_false>._M_head_impl + 8),(TypeName *)&gtest_ar_1)
  ;
  if ((char)analyser.super_ValueVisitor._vptr_ValueVisitor == '\0') {
    testing::Message::Message((Message *)&gtest_ar_1);
    if ((undefined8 *)CONCAT71(analyser._9_7_,analyser.valid_) == (undefined8 *)0x0) {
      pcVar1 = "";
    }
    else {
      pcVar1 = *(char **)CONCAT71(analyser._9_7_,analyser.valid_);
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_458,kFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/kamilsan[P]lazy-interpreted-language/tests/ExecutorTests.cpp"
               ,0x11,pcVar1);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_458,(Message *)&gtest_ar_1);
    this = (unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)&analyser.valid_;
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_458);
    if ((long *)CONCAT44(gtest_ar_1._4_4_,gtest_ar_1._0_4_) != (long *)0x0) {
      (**(code **)(*(long *)CONCAT44(gtest_ar_1._4_4_,gtest_ar_1._0_4_) + 8))();
    }
  }
  else {
    std::
    unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~unique_ptr((unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)&analyser.valid_);
    analyser.super_ValueVisitor._vptr_ValueVisitor = (_func_int **)&PTR__ValueVisitor_001d1278;
    analyser.valid_ = false;
    analyser.value_.super__Optional_base<double,_true,_true>._M_payload.
    super__Optional_payload_base<double>._M_engaged = false;
    (**(code **)(*(long *)executor.value_._M_t.
                          super___uniq_ptr_impl<Value,_std::default_delete<Value>_>._M_t.
                          super__Tuple_impl<0UL,_Value_*,_std::default_delete<Value>_>.
                          super__Head_base<0UL,_Value_*,_false>._M_head_impl + 0x18))
              (executor.value_._M_t.super___uniq_ptr_impl<Value,_std::default_delete<Value>_>._M_t.
               super__Tuple_impl<0UL,_Value_*,_std::default_delete<Value>_>.
               super__Head_base<0UL,_Value_*,_false>._M_head_impl,&analyser);
    if (analyser.value_.super__Optional_base<double,_true,_true>._M_payload.
        super__Optional_payload_base<double>._M_engaged == false) {
      std::__throw_bad_optional_access();
    }
    testing::internal::CmpHelperFloatingPointEQ<double>
              ((internal *)&gtest_ar_1,"res","value",
               analyser.value_.super__Optional_base<double,_true,_true>._M_payload.
               super__Optional_payload_base<double>._M_payload._M_value,value);
    if (gtest_ar_1.success_ == false) {
      testing::Message::Message((Message *)&local_458);
      if ((__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           )gtest_ar_1.message_._M_t.
            super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_t.
            super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            .
            super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
            ._M_head_impl ==
          (__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           )0x0) {
        pcVar1 = "";
      }
      else {
        pcVar1 = *(char **)gtest_ar_1.message_._M_t.
                           super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           ._M_t.
                           super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           .
                           super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                           ._M_head_impl;
      }
      testing::internal::AssertHelper::AssertHelper
                (&local_440,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/kamilsan[P]lazy-interpreted-language/tests/ExecutorTests.cpp"
                 ,0x16,pcVar1);
      testing::internal::AssertHelper::operator=(&local_440,(Message *)&local_458);
      testing::internal::AssertHelper::~AssertHelper(&local_440);
      if (local_458._M_head_impl !=
          (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        (**(code **)(*(long *)local_458._M_head_impl + 8))();
      }
    }
    this = &gtest_ar_1.message_;
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr(this);
  Executor::~Executor(&executor);
  if (local_438 != (undefined1  [8])0x0) {
    (**(code **)(*(long *)local_438 + 8))();
  }
  std::__detail::__variant::
  _Variant_storage<false,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>
  ::~_Variant_storage((_Variant_storage<false,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>
                       *)&parser.tokenizer_.token_.value);
  std::__cxx11::stringstream::~stringstream((stringstream *)&stream);
  return;
}

Assistant:

void testExpression(const std::string expr, double value)
{
  std::stringstream stream{expr};
  Parser parser{stream};
  auto node = parser.parseLogicalExpression();

  Executor executor{};
  node->accept(executor);
  const auto& val = executor.getValue();
  ASSERT_EQ(val->getType(), TypeName::F32);

  NumberValueAnalyser analyser{};
  val->accept(analyser);
  const auto res = analyser.getValue().value();
  EXPECT_DOUBLE_EQ(res, value);
}